

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

unsigned_long_long
pugi::impl::anon_unknown_0::string_to_integer<unsigned_long_long>
          (char_t *value,unsigned_long_long minv,unsigned_long_long maxv)

{
  byte bVar1;
  byte *pbVar2;
  char_t *local_88;
  char_t *local_80;
  bool local_75;
  bool local_71;
  size_t high_bit;
  char_t max_lead;
  size_t max_digits10;
  size_t digits_1;
  char_t *start_1;
  size_t digits;
  char_t *start;
  bool overflow;
  byte *pbStack_30;
  bool negative;
  char_t *s;
  unsigned_long_long result;
  unsigned_long_long maxv_local;
  unsigned_long_long minv_local;
  char_t *value_local;
  
  s = (char_t *)0x0;
  pbStack_30 = (byte *)value;
  while (((anonymous_namespace)::chartype_table[*pbStack_30] & 8) != 0) {
    pbStack_30 = pbStack_30 + 1;
  }
  bVar1 = *pbStack_30;
  local_71 = true;
  if (*pbStack_30 != 0x2b) {
    local_71 = *pbStack_30 == 0x2d;
  }
  pbStack_30 = pbStack_30 + (int)(uint)local_71;
  if ((*pbStack_30 == 0x30) && ((pbStack_30[1] | 0x20) == 0x78)) {
    for (pbStack_30 = pbStack_30 + 2; pbVar2 = pbStack_30, *pbStack_30 == 0x30;
        pbStack_30 = pbStack_30 + 1) {
    }
    do {
      if ((int)(char)*pbStack_30 - 0x30U < 10) {
        s = (char_t *)((long)s * 0x10 + (long)((char)*pbStack_30 + -0x30));
      }
      else {
        if (5 < ((int)(char)*pbStack_30 | 0x20U) - 0x61) goto LAB_0012e661;
        s = (char_t *)((long)s * 0x10 + (long)(int)(((int)(char)*pbStack_30 | 0x20U) - 0x57));
      }
      pbStack_30 = pbStack_30 + 1;
    } while( true );
  }
  for (; pbVar2 = pbStack_30, *pbStack_30 == 0x30; pbStack_30 = pbStack_30 + 1) {
  }
  for (; (int)(char)*pbStack_30 - 0x30U < 10; pbStack_30 = pbStack_30 + 1) {
    s = (char_t *)((long)s * 10 + (long)((char)*pbStack_30 + -0x30));
  }
  local_75 = false;
  if (0x13 < (ulong)((long)pbStack_30 - (long)pbVar2)) {
    local_75 = false;
    if (((long)pbStack_30 - (long)pbVar2 == 0x14) && (local_75 = true, '0' < (char)*pbVar2)) {
      local_75 = *pbVar2 == 0x31 && (long)s < 0;
    }
    local_75 = (bool)(local_75 ^ 1);
  }
LAB_0012e793:
  if (bVar1 == 0x2d) {
    local_80 = (char_t *)minv;
    if ((!local_75) && (s <= (char_t *)-minv)) {
      local_80 = (char_t *)-(long)s;
    }
    value_local = local_80;
  }
  else {
    local_88 = (char_t *)maxv;
    if ((!local_75) && (s <= maxv)) {
      local_88 = s;
    }
    value_local = local_88;
  }
  return (unsigned_long_long)value_local;
LAB_0012e661:
  local_75 = 0x10 < (ulong)((long)pbStack_30 - (long)pbVar2);
  goto LAB_0012e793;
}

Assistant:

PUGI__FN PUGI__UNSIGNED_OVERFLOW U string_to_integer(const char_t* value, U minv, U maxv)
	{
		U result = 0;
		const char_t* s = value;

		while (PUGI__IS_CHARTYPE(*s, ct_space))
			s++;

		bool negative = (*s == '-');

		s += (*s == '+' || *s == '-');

		bool overflow = false;

		if (s[0] == '0' && (s[1] | ' ') == 'x')
		{
			s += 2;

			// since overflow detection relies on length of the sequence skip leading zeros
			while (*s == '0')
				s++;

			const char_t* start = s;

			for (;;)
			{
				if (static_cast<unsigned>(*s - '0') < 10)
					result = result * 16 + (*s - '0');
				else if (static_cast<unsigned>((*s | ' ') - 'a') < 6)
					result = result * 16 + ((*s | ' ') - 'a' + 10);
				else
					break;

				s++;
			}

			size_t digits = static_cast<size_t>(s - start);

			overflow = digits > sizeof(U) * 2;
		}
		else
		{
			// since overflow detection relies on length of the sequence skip leading zeros
			while (*s == '0')
				s++;

			const char_t* start = s;

			for (;;)
			{
				if (static_cast<unsigned>(*s - '0') < 10)
					result = result * 10 + (*s - '0');
				else
					break;

				s++;
			}

			size_t digits = static_cast<size_t>(s - start);

			PUGI__STATIC_ASSERT(sizeof(U) == 8 || sizeof(U) == 4 || sizeof(U) == 2);

			const size_t max_digits10 = sizeof(U) == 8 ? 20 : sizeof(U) == 4 ? 10 : 5;
			const char_t max_lead = sizeof(U) == 8 ? '1' : sizeof(U) == 4 ? '4' : '6';
			const size_t high_bit = sizeof(U) * 8 - 1;

			overflow = digits >= max_digits10 && !(digits == max_digits10 && (*start < max_lead || (*start == max_lead && result >> high_bit)));
		}

		if (negative)
		{
			// Workaround for crayc++ CC-3059: Expected no overflow in routine.
		#ifdef _CRAYC
			return (overflow || result > ~minv + 1) ? minv : ~result + 1;
		#else
			return (overflow || result > 0 - minv) ? minv : 0 - result;
		#endif
		}
		else
			return (overflow || result > maxv) ? maxv : result;
	}